

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test3(void)

{
  bool bVar1;
  int *x;
  pointer piVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  queue<int> b;
  queue<int> a;
  int local_38 [8];
  
  CP::queue<int>::queue(&a);
  CP::queue<int>::queue(&b);
  local_38[4] = 0xfffffffd;
  local_38[5] = 9;
  local_38[6] = 6;
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 4;
  local_38[3] = 2;
  __l._M_len = 7;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&v1,__l,(allocator_type *)&v2);
  local_38[4] = 0xfffffffd;
  local_38[5] = 9;
  local_38[6] = 10000;
  local_38[0] = 1;
  local_38[1] = 5;
  local_38[2] = 4;
  local_38[3] = 2;
  __l_00._M_len = 7;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&v2,__l_00,&local_a9);
  for (piVar2 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar2 != v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    CP::queue<int>::push(&a,piVar2);
  }
  for (piVar2 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar2 != v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    CP::queue<int>::push(&b,piVar2);
  }
  bVar1 = CP::queue<int>::operator==(&a,&b);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = CP::queue<int>::operator==(&b,&a);
    bVar1 = !bVar1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v1.super__Vector_base<int,_std::allocator<int>_>);
  CP::queue<int>::~queue(&b);
  CP::queue<int>::~queue(&a);
  return bVar1;
}

Assistant:

bool test3() {
  CP::queue<int> a,b;
  std::vector<int> v1 = {1,5,4,2,-3,9,6};
  std::vector<int> v2 = {1,5,4,2,-3,9,10000};
  for (auto &x : v1) { a.push(x); }
  for (auto &x : v2) { b.push(x); }
  return ( ((a == b) == false)  && ((b == a) == false));
}